

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O2

int absl::lts_20250127::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  unsigned_long uVar8;
  
  if (0x13 < max_digits) {
    __assert_fail("max_digits <= std::numeric_limits<T>::digits10",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                  ,0xfc,
                  "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                 );
  }
  uVar8 = *out;
  for (lVar3 = 0; ((pcVar1 = begin + lVar3, uVar8 == 0 && (pcVar1 != end)) && (*pcVar1 == '0'));
      lVar3 = lVar3 + 1) {
  }
  pbVar6 = (byte *)(pcVar1 + max_digits);
  if ((long)(end + (-lVar3 - (long)begin)) <= (long)max_digits) {
    pbVar6 = (byte *)end;
  }
  while( true ) {
    if ((pbVar6 <= begin + lVar3) || (bVar4 = begin[lVar3], 9 < (byte)(bVar4 - 0x30))) {
      bVar4 = 0;
      for (; (begin + lVar3 < end && (cVar2 = begin[lVar3], (byte)(cVar2 - 0x30U) < 10));
          lVar3 = lVar3 + 1) {
        bVar4 = bVar4 | cVar2 != '0';
      }
      if (!(bool)(~bVar4 & 1 | dropped_nonzero_digit == (bool *)0x0)) {
        *dropped_nonzero_digit = true;
      }
      *out = uVar8;
      return (int)lVar3;
    }
    uVar7 = uVar8 * 10;
    if (uVar7 < uVar8) {
      __assert_fail("accumulator * base >= accumulator",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                    ,0x10e,
                    "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                   );
    }
    uVar5 = (ulong)(bVar4 & 0xf);
    uVar8 = uVar7 + uVar5;
    if (CARRY8(uVar7,uVar5)) break;
    lVar3 = lVar3 + 1;
  }
  __assert_fail("accumulator + digit >= accumulator",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                ,0x110,
                "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
               );
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}